

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operands.c
# Opt level: O2

void GetOperand(char *oper,OpConfig *op,int pcconv)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  char *pcVar5;
  size_t sVar6;
  char *pcVar7;
  byte bVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  int iStack_150;
  undefined8 local_140;
  char tempop [128];
  char UCoper [128];
  
  op->Defn = 0;
  op->Mode = 0;
  op->Value = 0;
  op->X = 0;
  op->Single = 0;
  op->Hunk = 0x7fff;
  bVar1 = *oper;
  if (bVar1 == 0) {
    return;
  }
  lVar12 = 0;
  bVar8 = bVar1;
  while (bVar8 != 0) {
    UCoper[lVar12] = bVar8 & 0xdf;
    lVar4 = lVar12 + 1;
    lVar12 = lVar12 + 1;
    bVar8 = oper[lVar4];
  }
  UCoper[lVar12] = '\0';
  if (bVar1 == 0x23) {
    pcVar5 = oper + 1;
    if (oper[1] == '~') {
      pcVar5 = oper + 2;
    }
    uVar3 = GetValue(pcVar5,op->Loc + 1);
    op->Value = uVar3;
    op->Mode = 0xc;
    lVar12 = Hunk2;
    op->Hunk = Hunk2;
    op->Defn = DefLine2;
    op->Single = SingleFlag;
    if (oper[1] != '~') {
      return;
    }
    if (lVar12 != 0x7fff) {
      Error(op->Loc + 2,0xc);
      op->Hunk = 0x7fff;
      uVar3 = op->Value;
    }
    uVar3 = ~uVar3;
    op->Value = uVar3;
    if (Size == 2) {
      uVar3 = uVar3 & 0xffff;
    }
    else {
      if (Size != 1) {
        return;
      }
      uVar3 = uVar3 & 0xff;
    }
LAB_00109035:
    op->Value = uVar3;
    return;
  }
  iVar10 = (int)lVar12;
  uVar2 = IsRegister(oper,iVar10);
  if (-1 < (int)uVar2) {
    op->Mode = 2 - (uint)((uVar2 & 8) == 0);
    uVar2 = uVar2 & 7;
    goto LAB_00108fc7;
  }
  if (uVar2 == 0xfffffffe) {
    op->Mode = 0xd;
    uVar3 = Sym->Val;
    goto LAB_00109035;
  }
  if (*oper == '-') {
    if ((oper[lVar12 + -1] != ')') || (oper[1] != '(')) goto LAB_001090ae;
    iVar10 = iVar10 + -3;
    uVar2 = IsRegister(oper + 2,iVar10);
    if ((uVar2 & 0xfffffff8) == 8) {
      op->Mode = 5;
LAB_0010907b:
      uVar2 = uVar2 - 8;
LAB_00108fc7:
      op->Rn = uVar2;
      return;
    }
    if (0 < (int)uVar2) {
LAB_00109107:
      iVar10 = op->Loc;
      iStack_150 = 8;
      goto LAB_0010910c;
    }
  }
  else {
    if (*oper == '(') {
      if (oper[lVar12 + -1] == '+') {
        if (oper[lVar12 + -2] == ')') {
          op->Mode = 4;
          uVar2 = GetAReg(oper + 1,iVar10 + -3,op->Loc + 1);
          goto LAB_00108fc7;
        }
      }
      else if (oper[lVar12 + -1] == ')') {
        iVar10 = iVar10 + -2;
        uVar2 = IsRegister(oper + 1,iVar10);
        if ((uVar2 & 0xfffffff8) == 8) {
          op->Mode = 3;
          goto LAB_0010907b;
        }
        if (uVar2 != 0xffffffff) goto LAB_00109107;
        goto LAB_00109127;
      }
    }
LAB_001090ae:
    iVar10 = 0x10dc0c;
    iVar11 = bcmp(UCoper,"SR",3);
    if (iVar11 == 0) {
      op->Mode = 0xe;
      return;
    }
    if (UCoper._0_4_ == 0x505355) {
      op->Mode = 0x10;
      return;
    }
    if (UCoper._0_4_ == 0x524343) {
      op->Mode = 0xf;
      return;
    }
  }
LAB_00109127:
  lVar4 = lVar12;
  if (oper[lVar12 + -1] == ')') {
    do {
      lVar9 = lVar4;
      lVar4 = lVar9 + -1;
      if (lVar4 < 2) break;
    } while (oper[lVar9 + -2] != '(');
    if (1 < lVar4) {
      if (lVar4 == 2) {
        if (*oper != '-') goto LAB_001092f9;
      }
      else if (oper[lVar9 + -3] == '*') {
        iVar11 = IsOperator(oper + lVar9 + -4);
        if ((iVar11 != 0) && (oper[lVar9 + -4] != ')')) {
LAB_001092f9:
          oper[lVar9 + -2] = '\0';
          lVar12 = GetValue(oper,op->Loc);
          op->Value = lVar12;
          op->Hunk = Hunk2;
          op->Defn = DefLine2;
          oper[lVar9 + -2] = '(';
          local_140 = (ulong)(uint)op->Loc;
          pcVar5 = GetField(oper + lVar4,tempop);
          if (*pcVar5 == '\0') {
            sVar6 = strlen(tempop);
            tempop[sVar6 - 1] = '\0';
          }
          if (((tempop[2] == '\0') && ((tempop[0] & 0xdfU) == 0x50)) &&
             ((tempop[1] & 0xdfU) == 0x43)) {
            op->Mode = 10;
            if (op->Hunk == CurrHunk) {
              op->Value = op->Value - (pcconv + AddrCnt);
              op->Hunk = 0x7fff;
            }
          }
          else {
            iVar10 = (int)local_140;
            if (((op->Value == 0) && (op->Hunk == 0x7fff)) &&
               ((op->Defn < LineCount && ((AdrModeA & 0x4000U) == 0 && NoOpt == 0)))) {
              iVar11 = 3;
            }
            else {
              iVar11 = 6;
            }
            op->Mode = iVar11;
            sVar6 = strlen(tempop);
            iVar10 = GetAReg(tempop,(int)sVar6,iVar10 + (int)lVar4);
            op->Rn = iVar10;
          }
          if (*pcVar5 != '\0') {
            op->Mode = (uint)(op->Mode == 10) * 4 + 7;
            if (*pcVar5 != ',') {
              Error(op->Loc,8);
            }
            iVar10 = (op->Loc + (int)(pcVar5 + 1)) - (uint)oper;
            pcVar7 = GetField(pcVar5 + 1,tempop);
            sVar6 = strlen(tempop);
            pcVar5 = tempop;
            if (*pcVar7 == '\0') {
              tempop[sVar6 - 1] = '\0';
              pcVar5 = (char *)((long)&local_140 + 7);
            }
            else {
              Error(iVar10,8);
            }
            pcVar5 = pcVar5 + sVar6;
            if ((pcVar5 + -2 < tempop) || (pcVar5[-2] != '.')) {
              op->Xsize = 2;
              iVar11 = (int)pcVar5 + 1;
            }
            else {
              iVar11 = (int)pcVar5 + -1;
              pcVar5[-2] = '\0';
              if ((pcVar5[-1] & 0xdfU) == 0x4c) {
                op->Xsize = 4;
              }
              else {
                if ((pcVar5[-1] & 0xdfU) != 0x57) {
                  Error(~(uint)oper + (int)pcVar7 + op->Loc,9);
                }
                op->Xsize = 2;
              }
            }
            uVar2 = IsRegister(tempop,iVar11 + ~(uint)tempop);
            op->Xn = uVar2 & 7;
            if (uVar2 < 8) {
              op->X = 1;
            }
            else if ((uVar2 & 0xfffffff8) == 8) {
              op->X = 2;
            }
            else {
              Error(iVar10,8);
            }
          }
          if (op->Hunk == 0x7fff || op->Hunk < 0) {
            return;
          }
          Error(op->Loc,0xc);
          return;
        }
      }
      else {
        iVar11 = IsOperator(oper + lVar9 + -3);
        if ((iVar11 == 0) || (oper[lVar9 + -3] == ')')) goto LAB_001092f9;
      }
    }
  }
  iVar10 = GetMultReg(oper,iVar10);
  if (iVar10 != 0) {
    op->Value = (long)iVar10;
    op->Mode = 0xd;
    return;
  }
  if ((((*oper == '(') && (oper[lVar12 + -3] == ')')) && (oper[lVar12 + -2] == '.')) &&
     (((oper[lVar12 + -1] & 0xdfU) == 0x57 || ((oper[lVar12 + -1] & 0xdfU) == 0x4c)))) {
    oper[lVar12 + -2] = '\0';
    lVar4 = GetValue(oper,op->Loc);
    op->Value = lVar4;
    op->Hunk = Hunk2;
    op->Defn = DefLine2;
    op->Single = SingleFlag;
    op->Mode = (oper[lVar12 + -1] & 0xdfU) == 0x57 ^ 9;
    oper[lVar12 + -2] = '.';
    return;
  }
  uVar3 = GetValue(oper,op->Loc);
  op->Value = uVar3;
  lVar12 = Hunk2;
  op->Hunk = Hunk2;
  iVar11 = DefLine2;
  op->Defn = DefLine2;
  op->Single = SingleFlag;
  op->Mode = 9;
  iVar10 = SmallData;
  if (NoOpt != 0) {
    return;
  }
  if (iVar11 < LineCount) {
    if (lVar12 < 0) {
      return;
    }
    if (lVar12 == CurrHunk) {
      if (pcconv == 0) {
        return;
      }
      lVar12 = uVar3 - (pcconv + AddrCnt);
      if ((short)lVar12 != lVar12) {
        return;
      }
      op->Mode = 10;
    }
    else {
      if (lVar12 == 0x7fff) {
        if ((long)(short)uVar3 != uVar3) {
          return;
        }
        goto LAB_00109679;
      }
      if (0xffff < uVar3 || SmallData == -1) {
        return;
      }
      op->Mode = 6;
      op->Rn = iVar10;
      lVar12 = uVar3 - DataOffset;
    }
    op->Value = lVar12;
  }
  else {
    if (SmallData == -1) {
      return;
    }
    if ((AdrModeA & 0x20U) != 0) {
      return;
    }
    if (Pass2 != 0) {
      if (-1 < lVar12) {
        if (lVar12 == CurrHunk) {
          op->Mode = 10;
          lVar12 = uVar3 - (pcconv + AddrCnt);
          op->Value = lVar12;
          op->Hunk = 0x7fff;
          if ((pcconv != 0) && (0xfffffffffffeffff < lVar12 - 0x8000U)) {
            return;
          }
        }
        else {
          if (lVar12 == 0x7fff) {
            op->Mode = 8;
          }
          else {
            op->Mode = 6;
            op->Rn = iVar10;
            uVar3 = uVar3 - DataOffset;
            op->Value = uVar3;
          }
          if ((long)(short)uVar3 == uVar3) {
            return;
          }
        }
        iVar10 = op->Loc;
        iStack_150 = 0xe;
LAB_0010910c:
        Error(iVar10,iStack_150);
        return;
      }
      Error(op->Loc,0xe);
LAB_00109679:
      op->Mode = 8;
      return;
    }
    op->Mode = 6;
    op->Rn = iVar10;
  }
  op->Hunk = 0x7fff;
  return;
}

Assistant:

void 
GetOperand (char *oper, register struct OpConfig *op, int pcconv)
/* Finds mode and value for source or destination operand.
 If PC-relative addressing is permitted, "pcconv" gives the
 offset to the displacement word; otherwise "pcconv" is zero. */
{
	register char *s, *t;
	register int i;
	char *opend;
	char UCoper[MAXLINE], tempop[MAXLINE];
	int rloc;
	long templong;

	op->Value = op->Defn = 0;
	op->Mode = Null;
	op->X = X0;
	op->Hunk = ABSHUNK;
	op->Single = FALSE;

	if (*oper == '\0')
		return; /* There is nothing to process. */

	s = oper;
	t = UCoper;
	while (*s) {
#ifdef FASTTOUPPER
		*t++ = *s & (~ (1<<5)); /* Upper-case version */
#else
		*t++ = toupper(*s); /* Upper-case version */
#endif
		s++;
	}
	*t = '\0';
	opend = s - 1; /* Last character of operand */

	if (*oper == '#') { /* Immediate */
		s = oper + 1; /* The value starts here. */
		if (*s == '~')
			s++; /* Skip over unary NOT. */
		op->Value = GetValue(s, (op->Loc) + 1);
		op->Mode = Imm;
		op->Hunk = Hunk2;
		op->Defn = DefLine2;
		op->Single = SingleFlag;
		if (*(oper + 1) == '~') { /* Unary NOT of entire value */
			if (Hunk2 != ABSHUNK) {
				Error(op->Loc + 2, RelErr);
				op->Hunk = ABSHUNK; /* Must be absolute! */
			}
			op->Value = ~(op->Value); /* Flip all bits. */
			if (Size == Byte)
				op->Value &= 0xFFL; /* Trim to 8 bits. */
			else if (Size == Word)
				op->Value &= 0xFFFFL; /* Trim to 16 bits. */
		}
		return;
	}

	i = IsRegister(oper, opend - oper + 1);
	if (i >= 0) {
		op->Mode = (i & 8) ? ARDir : DReg; /* Register type */
		op->Rn = i & 7; /* Register number */
		return;
	} else if (i == -2) {
		op->Mode = MultiM; /* Equated register list */
		op->Value = Sym->Val;
		return;
	} else if ((*oper == '(') && (*opend == ')')) {
		i = IsRegister(oper + 1, opend - oper - 1);
		if (i >= 8 && i <= 15) {
			op->Mode = ARInd; /* Address Register indirect */
			op->Rn = i - 8;
			return;
		} else if (i != -1) {
			Error(op->Loc, AddrErr); /* Data register is invalid! */
			return;
		} /* else may be parenthesized expression */
	} else if ((*oper == '(') /* Post-increment */
	&& (*opend == '+') && (*(opend - 1) == ')')) {
		op->Mode = ARPost;
		op->Rn = GetAReg(oper + 1, opend - oper - 2, op->Loc + 1);
		return;
	} else if ((*oper == '-') /* Pre-decrement */
	&& (*opend == ')') && (*(oper + 1) == '(')) {
		i = IsRegister(oper + 2, opend - oper - 2);
		if (i >= 8 && i <= 15) {
			op->Mode = ARPre;
			op->Rn = i - 8;
			return;
		} else if (i > 0) {
			Error(op->Loc, AddrErr); /* Data register is invalid! */
			return;
		} /* else parenthesized expression with leading minus? */
	} else if (strcmp(UCoper, "SR") == 0) {
		op->Mode = SR; /* Status Register */
		return;
	} else if (strcmp(UCoper, "CCR") == 0) {
		op->Mode = CCR; /* Condition Code Register */
		return;
	} else if (strcmp(UCoper, "USP") == 0) {
		op->Mode = USP; /* User Stack Pointer */
		return;
	}

	/* Try to split off displacement (if present).
	 We'll assume we have a register expression if the operand
	 ends with a parenthesized expression not preceded by an
	 operator.  I know this code is a real kludge, but that's
	 the result of the bloody syntax.  Thanks, Motorola.	*/

	s = opend; /* Last character */
	if ((i = (*s == ')'))) /* Trailing parenthesis? */
		while (*(--s) != '(') /* Find left parenthesis. */
			if (s <= oper)
				break;
	if (s <= oper) /* Must not be at beginning. */
		i = FALSE;
	if (i) {
		if (s == (oper + 1)) {
			if (*oper == '-')
				i = FALSE; /* Leading minus sign */
		} else {
			t = s - 1;
			if (*t == '*') { /* Location counter? */
				t--;
				if (!IsOperator(t) || (*t == ')'))
					i = FALSE; /* No, it's multiplication. */
			} else if (IsOperator(t) && (*t != ')')) {
				i = FALSE; /* Preceded by an operator */
			}
		}
	}

	if (i) { /* Looks like a displacement mode */
		*s = '\0';
		op->Value = GetValue(oper, op->Loc); /* Displacement */
		op->Hunk = Hunk2; /* Hunk number */
		op->Defn = DefLine2; /* Line where defined */
		*s++ = '('; /* Restore parenthesis. */

		rloc = op->Loc + s - oper; /* The register starts here. */
		s = GetField(s, tempop); /* Get address register. */
		if (*s == '\0') /* If there's no index register, */
			tempop[strlen(tempop) - 1] = '\0'; /* chop off parenthesis. */

		if ((tempop[2] == '\0') && ((tempop[0] & (~ (1<<5))) == 'P')
				&& ((tempop[1] & (~ (1<<5))) == 'C')) {
			op->Mode = PCDisp; /* Program Counter */
			if (op->Hunk == CurrHunk) {
				op->Value -= (AddrCnt + pcconv); /* Adjust displacement. */
				op->Hunk = ABSHUNK;
			}
		} else {
			if ((op->Value == 0) /* If displacement is zero   */
			&& (op->Hunk == ABSHUNK) /*  and is absolute          */
			&& (op->Defn < LineCount) /*  and is already defined   */
			&& !(OpM68R IN AdrModeA) /*  and isn't for a MOVEP    */
			&& !NoOpt) /*  and we can optimize      */
				op->Mode = ARInd; /*  forget the displacement. */
			else
				op->Mode = ARDisp; /* Address reg. w/displacement */
			op->Rn = GetAReg(tempop, strlen(tempop), rloc);
		}
		if (*s != '\0') { /* Index register is present. */
			if (op->Mode == PCDisp)
				op->Mode = PCDisX; /* Program Counter indexed */
			else
				op->Mode = ARDisX; /* Address Register indexed */
			if (*s != ',')
				Error(op->Loc, AddrErr); /* Bad separator */
			s++; /* Skip separator. */
			rloc = op->Loc + s - oper; /* Start of index */
			s = GetField(s, tempop); /* Get index register. */
			t = tempop + strlen(tempop);
			if (*s == '\0')
				*(--t) = '\0'; /* Chop parenthesis. */
			else
				Error(rloc, AddrErr); /* It better be there. */

			t -= 2;
			if ((t < tempop) || (*t != '.')) {
				op->Xsize = Word; /* Size defaults to 16 bits. */
				t += 3;
			} else {
				*t++ = '\0'; /* Chop off size code. */
				//switch (toupper(*t)) {
				switch (*t & (~ (1<<5))) {
				case 'W': /* Word */
					op->Xsize = Word;
					break;
				case 'L': /* Long */
					op->Xsize = Long;
					break;
				default:
					Error(op->Loc + s - 1 - oper, SizeErr); /* Invalid size */
					op->Xsize = Word; /* Make it word for now. */
				}
			}
			i = IsRegister(tempop, t - tempop - 1); /* Get register. */
			op->Xn = i & 7; /* Index register number */
			if ((i >= 0) && (i <= 7))
				op->X = Dreg; /* Data Register */
			else if ((i >= 8) && (i <= 15))
				op->X = Areg; /* Address Register */
			else
				Error(rloc, AddrErr); /* Invalid register */
		}

		if ((op->Hunk >= 0) && (op->Hunk != ABSHUNK))
			Error(op->Loc, RelErr); /*  Relocatable displacement */
		return;
	}

	if ((i = GetMultReg(oper, op->Loc)) != 0) {
		op->Value = (long) i;
		op->Mode = MultiM; /* Register list for MOVEM */
		return;
	}

	if ((*oper == '(') /* Operands of the form (xxxx).W or (xxxx).L */
	&& (*(opend - 2) == ')') && (*(opend - 1) == '.')
			&& (((*opend & (~ (1<<5))) == 'W') || ((*opend & (~ (1<<5))) == 'L'))) {
		*(opend - 1) = '\0'; /* Temporarily cut off length specifier. */
		op->Value = GetValue(oper, op->Loc); /* Get operand value. */
		op->Hunk = Hunk2;
		op->Defn = DefLine2;
		op->Single = SingleFlag;
		if ((*opend & (~ (1<<5))) == 'W')
			op->Mode = AbsW; /* Absolute word */
		else
			op->Mode = AbsL; /* Absolute long */
		*(opend - 1) = '.'; /* Restore original operand. */
		return;
	}

	op->Value = GetValue(oper, op->Loc); /* Plain old expression */
	op->Hunk = Hunk2;
	op->Defn = DefLine2;
	op->Single = SingleFlag;
	op->Mode = AbsL; /* Assume absolute long addressing. */

	if (NoOpt)
		return; /* Do no optimizing. */

	if (DefLine2 < LineCount) { /* Backward reference */

		if (Hunk2 < 0) {
			return; /* External - leave as absolute long. */

		} else if (Hunk2 == CurrHunk) { /* Reference to current hunk */
			if (pcconv) {
				templong = op->Value - (AddrCnt + pcconv); /* PC disp. */
				if ((templong >= -32768) && (templong <= 32767)) {
					op->Mode = PCDisp; /* Convert to PC relative mode. */
					op->Value = templong; /* Adjust displacement. */
					op->Hunk = ABSHUNK;
				}
			}

		} else if (Hunk2 == ABSHUNK) { /* Absolute value */
			if ((op->Value >= -32768) && (op->Value <= 32767))
				op->Mode = AbsW; /* Absolute word */

		} else if ((SmallData != -1) && (op->Value >= 0)
				&& (op->Value <= 65535L)) {
			op->Mode = ARDisp; /* Make it a data reference     */
			op->Rn = SmallData; /*  through specified register. */
			op->Value -= DataOffset; /* Adjust displacement. */
			op->Hunk = ABSHUNK;
		}
		return; /* Could default to absolute long. */

	} else if (SmallData == -1) { /* Fwd. reference - if not small data, */
		return; /*  leave as absolute long addressing. */

	} else if (Brnch IN AdrModeA) {
		return; /* Branches are handled elsewhere. */

	} else if (!Pass2) { /* Forward reference, pass 1 */
		op->Mode = ARDisp; /* Assume displacement       */
		op->Rn = SmallData; /*  from specified register. */
		op->Hunk = ABSHUNK;
		return;

	} else { /* On pass 2 we know what it is. */

		if (Hunk2 < 0) {
			Error(op->Loc, FwdRef); /* External - must be 32 bits. */
			op->Mode = AbsW; /* Force absolute word anyway. */

		} else if (Hunk2 == CurrHunk) { /* It's in the current hunk. */
			op->Mode = PCDisp; /* Convert to PC relative mode. */
			op->Value -= AddrCnt + pcconv; /* Adjust displacement. */
			op->Hunk = ABSHUNK;
			if (!pcconv || (op->Value < -32768) || (op->Value > 32767))
				Error(op->Loc, FwdRef); /* It doesn't fit! */

		} else if (Hunk2 == ABSHUNK) { /* It's absolute. */
			op->Mode = AbsW; /* It has to fit in a word. */
			if ((op->Value < -32768) || (op->Value > 32767))
				Error(op->Loc, FwdRef); /* It doesn't fit! */

		} else {
			op->Mode = ARDisp; /* Assume data reference        */
			op->Rn = SmallData; /*  through specified register. */
			op->Value -= DataOffset; /* Adjust displacement. */
			if ((op->Value < -32768) || (op->Value > 32767))
				Error(op->Loc, FwdRef); /* It doesn't fit! */
		}
	}
}